

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O2

void __thiscall NaControlLaw::~NaControlLaw(NaControlLaw *this)

{
  (this->super_NaUnit).super_NaLogging._vptr_NaLogging = (_func_int **)&PTR_PrintLog_00173ba0;
  (this->super_NaConfigPart)._vptr_NaConfigPart = (_func_int **)&PTR__NaControlLaw_00173c20;
  if (this->dataio != (NaDataFile *)0x0) {
    (*this->dataio->_vptr_NaDataFile[1])();
  }
  if (this->filepath != (char *)0x0) {
    operator_delete__(this->filepath);
  }
  NaLinearNoiseGen::~NaLinearNoiseGen(&this->lin_rand);
  NaDynAr<NaControlLawItem>::~NaDynAr(&this->items);
  NaConfigPart::~NaConfigPart(&this->super_NaConfigPart);
  NaUnit::~NaUnit(&this->super_NaUnit);
  return;
}

Assistant:

NaControlLaw::~NaControlLaw ()
{
    delete dataio;
    delete[] filepath;
}